

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O1

R_conflict4 createSlack(QSimplexConstraint *sizeConstraint,qreal interval,slackType type)

{
  QSimplexConstraint *this;
  long in_FS_OFFSET;
  R_conflict4 RVar1;
  QSimplexVariable *copy;
  double local_48;
  QSimplexVariable *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  RVar1.slack = (QSimplexVariable *)operator_new(0x10);
  ((QSimplexVariable *)&(RVar1.slack)->result)->result = 0.0;
  (RVar1.slack)->index = 0;
  local_48 = (double)type;
  local_40 = RVar1.slack;
  QHash<QSimplexVariable*,double>::emplace<double_const&>
            ((QHash<QSimplexVariable*,double> *)sizeConstraint,&local_40,&local_48);
  this = (QSimplexConstraint *)operator_new(0x30);
  (this->variables).d = (Data *)0x0;
  this->constant = 0.0;
  this->ratio = Equal;
  (this->helper).first = (QConcreteSimplexVariable *)0x0;
  (this->helper).second = 0.0;
  this->artificial = (QConcreteSimplexVariable *)0x0;
  local_48 = 1.0;
  local_40 = RVar1.slack;
  QHash<QSimplexVariable*,double>::emplace<double_const&>
            ((QHash<QSimplexVariable*,double> *)this,&local_40,&local_48);
  this->ratio = LessOrEqual;
  this->constant = interval;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    RVar1.limit = this;
    return RVar1;
  }
  __stack_chk_fail();
}

Assistant:

static auto createSlack(QSimplexConstraint *sizeConstraint, qreal interval, slackType type)
{
    struct R {
        QConcreteSimplexVariable *slack;
        QSimplexConstraint *limit;
    };

    auto slack = new QConcreteSimplexVariable;
    sizeConstraint->variables.insert(slack, type);

    QSimplexConstraint *limit = new QSimplexConstraint;
    limit->variables.insert(slack, 1.0);
    limit->ratio = QSimplexConstraint::LessOrEqual;
    limit->constant = interval;

    return R{slack, limit};
}